

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Bool prvTidyIsXMLNamechar(uint c)

{
  Bool BVar1;
  bool local_e;
  bool local_d;
  uint c_local;
  
  BVar1 = prvTidyIsXMLLetter(c);
  local_d = true;
  if (((((((((BVar1 == no) && (local_d = true, c != 0x2e)) && (local_d = true, c != 0x5f)) &&
          ((local_d = true, c != 0x3a && (local_d = true, c != 0x2d)))) &&
         (((c < 0x300 || (local_d = true, 0x345 < c)) &&
          ((c < 0x360 || (local_d = true, 0x361 < c)))))) &&
        ((c < 0x483 || (local_d = true, 0x486 < c)))) &&
       ((((((((c < 0x591 || (local_d = true, 0x5a1 < c)) &&
             ((c < 0x5a3 || (local_d = true, 0x5b9 < c)))) &&
            ((((c < 0x5bb || (local_d = true, 0x5bd < c)) && (local_d = true, c != 0x5bf)) &&
             (((c < 0x5c1 || (local_d = true, 0x5c2 < c)) && (local_d = true, c != 0x5c4)))))) &&
           (((c < 0x64b || (local_d = true, 0x652 < c)) &&
            ((local_d = true, c != 0x670 && ((c < 0x6d6 || (local_d = true, 0x6dc < c)))))))) &&
          (((c < 0x6dd || (local_d = true, 0x6df < c)) &&
           ((c < 0x6e0 || (local_d = true, 0x6e4 < c)))))) &&
         ((c < 0x6e7 || (local_d = true, 0x6e8 < c)))) &&
        (((c < 0x6ea || (local_d = true, 0x6ed < c)) && ((c < 0x901 || (local_d = true, 0x903 < c)))
         ))))) &&
      (((((((local_d = true, c != 0x93c &&
            (((c < 0x93e || (local_d = true, 0x94c < c)) && (local_d = true, c != 0x94d)))) &&
           (((c < 0x951 || (local_d = true, 0x954 < c)) &&
            ((c < 0x962 || (local_d = true, 0x963 < c)))))) &&
          (((c < 0x981 || (local_d = true, 0x983 < c)) &&
           ((local_d = true, c != 0x9bc &&
            ((local_d = true, c != 0x9be && (local_d = true, c != 0x9bf)))))))) &&
         ((c < 0x9c0 || (local_d = true, 0x9c4 < c)))) &&
        ((((c < 0x9c7 || (local_d = true, 0x9c8 < c)) &&
          (((((((((c < 0x9cb || (local_d = true, 0x9cd < c)) && (local_d = true, c != 0x9d7)) &&
                (((((c < 0x9e2 || (local_d = true, 0x9e3 < c)) && (local_d = true, c != 0xa02)) &&
                  ((local_d = true, c != 0xa3c && (local_d = true, c != 0xa3e)))) &&
                 (local_d = true, c != 0xa3f)))) &&
               ((((c < 0xa40 || (local_d = true, 0xa42 < c)) &&
                 ((c < 0xa47 || (local_d = true, 0xa48 < c)))) &&
                ((c < 0xa4b || (local_d = true, 0xa4d < c)))))) &&
              ((c < 0xa70 || (local_d = true, 0xa71 < c)))) &&
             (((((c < 0xa81 || (local_d = true, 0xa83 < c)) && (local_d = true, c != 0xabc)) &&
               (((c < 0xabe || (local_d = true, 0xac5 < c)) &&
                ((c < 0xac7 || (local_d = true, 0xac9 < c)))))) &&
              ((c < 0xacb || (local_d = true, 0xacd < c)))))) &&
            ((c < 0xb01 || (local_d = true, 0xb03 < c)))) &&
           ((local_d = true, c != 0xb3c && ((c < 0xb3e || (local_d = true, 0xb43 < c)))))))) &&
         (((c < 0xb47 || (local_d = true, 0xb48 < c)) &&
          ((((c < 0xb4b || (local_d = true, 0xb4d < c)) &&
            ((c < 0xb56 || (local_d = true, 0xb57 < c)))) &&
           ((c < 0xb82 || (local_d = true, 0xb83 < c)))))))))) &&
       (((c < 0xbbe || (local_d = true, 0xbc2 < c)) &&
        (((((c < 0xbc6 || (local_d = true, 0xbc8 < c)) &&
           ((c < 0xbca || (local_d = true, 0xbcd < c)))) &&
          ((local_d = true, c != 0xbd7 && ((c < 0xc01 || (local_d = true, 0xc03 < c)))))) &&
         ((((c < 0xc3e || (local_d = true, 0xc44 < c)) &&
           ((c < 0xc46 || (local_d = true, 0xc48 < c)))) &&
          (((c < 0xc4a || (local_d = true, 0xc4d < c)) &&
           (((((c < 0xc55 || (local_d = true, 0xc56 < c)) &&
              ((c < 0xc82 || (local_d = true, 0xc83 < c)))) &&
             ((c < 0xcbe || (local_d = true, 0xcc4 < c)))) &&
            ((((c < 0xcc6 || (local_d = true, 0xcc8 < c)) &&
              (((c < 0xcca || (local_d = true, 0xccd < c)) &&
               ((c < 0xcd5 || (local_d = true, 0xcd6 < c)))))) &&
             ((c < 0xd02 || (local_d = true, 0xd03 < c)))))))))))))))))) &&
     ((((c < 0xd3e || (local_d = true, 0xd43 < c)) &&
       (((((c < 0xd46 || (local_d = true, 0xd48 < c)) &&
          ((c < 0xd4a || (local_d = true, 0xd4d < c)))) &&
         (((local_d = true, c != 0xd57 && (local_d = true, c != 0xe31)) &&
          ((c < 0xe34 || (local_d = true, 0xe3a < c)))))) &&
        (((((((c < 0xe47 || (local_d = true, 0xe4e < c)) && (local_d = true, c != 0xeb1)) &&
            ((((c < 0xeb4 || (local_d = true, 0xeb9 < c)) &&
              ((c < 0xebb || (local_d = true, 0xebc < c)))) &&
             ((c < 0xec8 || (local_d = true, 0xecd < c)))))) &&
           ((c < 0xf18 || (local_d = true, 0xf19 < c)))) &&
          (((((local_d = true, c != 0xf35 && (local_d = true, c != 0xf37)) &&
             (local_d = true, c != 0xf39)) &&
            ((local_d = true, c != 0xf3e && (local_d = true, c != 0xf3f)))) &&
           ((c < 0xf71 || (local_d = true, 0xf84 < c)))))) &&
         ((((c < 0xf86 || (local_d = true, 0xf8b < c)) &&
           ((c < 0xf90 || (local_d = true, 0xf95 < c)))) &&
          ((local_d = true, c != 0xf97 && ((c < 0xf99 || (local_d = true, 0xfad < c)))))))))))) &&
      ((((c < 0xfb1 || (local_d = true, 0xfb7 < c)) &&
        ((((((local_d = true, c != 0xfb9 &&
             (((c < 0x20d0 || (local_d = true, 0x20dc < c)) && (local_d = true, c != 0x20e1)))) &&
            (((c < 0x302a || (local_d = true, 0x302f < c)) && (local_d = true, c != 0x3099)))) &&
           ((local_d = true, c != 0x309a && ((c < 0x30 || (local_d = true, 0x39 < c)))))) &&
          ((c < 0x660 || (local_d = true, 0x669 < c)))) &&
         (((c < 0x6f0 || (local_d = true, 0x6f9 < c)) &&
          (((c < 0x966 || (local_d = true, 0x96f < c)) &&
           ((c < 0x9e6 || (local_d = true, 0x9ef < c)))))))))) &&
       ((((((c < 0xa66 || (local_d = true, 0xa6f < c)) &&
           (((c < 0xae6 || (local_d = true, 0xaef < c)) &&
            ((c < 0xb66 || (local_d = true, 0xb6f < c)))))) &&
          ((c < 0xbe7 || (local_d = true, 0xbef < c)))) &&
         ((((c < 0xc66 || (local_d = true, 0xc6f < c)) &&
           ((((c < 0xce6 || (local_d = true, 0xcef < c)) &&
             ((c < 0xd66 || (local_d = true, 0xd6f < c)))) &&
            ((c < 0xe50 || (local_d = true, 0xe59 < c)))))) &&
          ((c < 0xed0 || (local_d = true, 0xed9 < c)))))) &&
        ((((((c < 0xf20 || (local_d = true, 0xf29 < c)) && (local_d = true, c != 0xb7)) &&
           (((local_d = true, c != 0x2d0 && (local_d = true, c != 0x2d1)) &&
            ((local_d = true, c != 0x387 &&
             ((local_d = true, c != 0x640 && (local_d = true, c != 0xe46)))))))) &&
          ((local_d = true, c != 0xec6 &&
           ((local_d = true, c != 0x3005 && ((c < 0x3031 || (local_d = true, 0x3035 < c)))))))) &&
         ((c < 0x309d || (local_d = true, 0x309e < c)))))))))))) {
    local_e = 0x30fb < c && c < 0x30ff;
    local_d = local_e;
  }
  return (Bool)local_d;
}

Assistant:

Bool TY_(IsXMLNamechar)(uint c)
{
    return (TY_(IsXMLLetter)(c) ||
        c == '.' || c == '_' ||
        c == ':' || c == '-' ||
        (c >= 0x300 && c <= 0x345) ||
        (c >= 0x360 && c <= 0x361) ||
        (c >= 0x483 && c <= 0x486) ||
        (c >= 0x591 && c <= 0x5a1) ||
        (c >= 0x5a3 && c <= 0x5b9) ||
        (c >= 0x5bb && c <= 0x5bd) ||
        c == 0x5bf ||
        (c >= 0x5c1 && c <= 0x5c2) ||
        c == 0x5c4 ||
        (c >= 0x64b && c <= 0x652) ||
        c == 0x670 ||
        (c >= 0x6d6 && c <= 0x6dc) ||
        (c >= 0x6dd && c <= 0x6df) ||
        (c >= 0x6e0 && c <= 0x6e4) ||
        (c >= 0x6e7 && c <= 0x6e8) ||
        (c >= 0x6ea && c <= 0x6ed) ||
        (c >= 0x901 && c <= 0x903) ||
        c == 0x93c ||
        (c >= 0x93e && c <= 0x94c) ||
        c == 0x94d ||
        (c >= 0x951 && c <= 0x954) ||
        (c >= 0x962 && c <= 0x963) ||
        (c >= 0x981 && c <= 0x983) ||
        c == 0x9bc ||
        c == 0x9be ||
        c == 0x9bf ||
        (c >= 0x9c0 && c <= 0x9c4) ||
        (c >= 0x9c7 && c <= 0x9c8) ||
        (c >= 0x9cb && c <= 0x9cd) ||
        c == 0x9d7 ||
        (c >= 0x9e2 && c <= 0x9e3) ||
        c == 0xa02 ||
        c == 0xa3c ||
        c == 0xa3e ||
        c == 0xa3f ||
        (c >= 0xa40 && c <= 0xa42) ||
        (c >= 0xa47 && c <= 0xa48) ||
        (c >= 0xa4b && c <= 0xa4d) ||
        (c >= 0xa70 && c <= 0xa71) ||
        (c >= 0xa81 && c <= 0xa83) ||
        c == 0xabc ||
        (c >= 0xabe && c <= 0xac5) ||
        (c >= 0xac7 && c <= 0xac9) ||
        (c >= 0xacb && c <= 0xacd) ||
        (c >= 0xb01 && c <= 0xb03) ||
        c == 0xb3c ||
        (c >= 0xb3e && c <= 0xb43) ||
        (c >= 0xb47 && c <= 0xb48) ||
        (c >= 0xb4b && c <= 0xb4d) ||
        (c >= 0xb56 && c <= 0xb57) ||
        (c >= 0xb82 && c <= 0xb83) ||
        (c >= 0xbbe && c <= 0xbc2) ||
        (c >= 0xbc6 && c <= 0xbc8) ||
        (c >= 0xbca && c <= 0xbcd) ||
        c == 0xbd7 ||
        (c >= 0xc01 && c <= 0xc03) ||
        (c >= 0xc3e && c <= 0xc44) ||
        (c >= 0xc46 && c <= 0xc48) ||
        (c >= 0xc4a && c <= 0xc4d) ||
        (c >= 0xc55 && c <= 0xc56) ||
        (c >= 0xc82 && c <= 0xc83) ||
        (c >= 0xcbe && c <= 0xcc4) ||
        (c >= 0xcc6 && c <= 0xcc8) ||
        (c >= 0xcca && c <= 0xccd) ||
        (c >= 0xcd5 && c <= 0xcd6) ||
        (c >= 0xd02 && c <= 0xd03) ||
        (c >= 0xd3e && c <= 0xd43) ||
        (c >= 0xd46 && c <= 0xd48) ||
        (c >= 0xd4a && c <= 0xd4d) ||
        c == 0xd57 ||
        c == 0xe31 ||
        (c >= 0xe34 && c <= 0xe3a) ||
        (c >= 0xe47 && c <= 0xe4e) ||
        c == 0xeb1 ||
        (c >= 0xeb4 && c <= 0xeb9) ||
        (c >= 0xebb && c <= 0xebc) ||
        (c >= 0xec8 && c <= 0xecd) ||
        (c >= 0xf18 && c <= 0xf19) ||
        c == 0xf35 ||
        c == 0xf37 ||
        c == 0xf39 ||
        c == 0xf3e ||
        c == 0xf3f ||
        (c >= 0xf71 && c <= 0xf84) ||
        (c >= 0xf86 && c <= 0xf8b) ||
        (c >= 0xf90 && c <= 0xf95) ||
        c == 0xf97 ||
        (c >= 0xf99 && c <= 0xfad) ||
        (c >= 0xfb1 && c <= 0xfb7) ||
        c == 0xfb9 ||
        (c >= 0x20d0 && c <= 0x20dc) ||
        c == 0x20e1 ||
        (c >= 0x302a && c <= 0x302f) ||
        c == 0x3099 ||
        c == 0x309a ||
        (c >= 0x30 && c <= 0x39) ||
        (c >= 0x660 && c <= 0x669) ||
        (c >= 0x6f0 && c <= 0x6f9) ||
        (c >= 0x966 && c <= 0x96f) ||
        (c >= 0x9e6 && c <= 0x9ef) ||
        (c >= 0xa66 && c <= 0xa6f) ||
        (c >= 0xae6 && c <= 0xaef) ||
        (c >= 0xb66 && c <= 0xb6f) ||
        (c >= 0xbe7 && c <= 0xbef) ||
        (c >= 0xc66 && c <= 0xc6f) ||
        (c >= 0xce6 && c <= 0xcef) ||
        (c >= 0xd66 && c <= 0xd6f) ||
        (c >= 0xe50 && c <= 0xe59) ||
        (c >= 0xed0 && c <= 0xed9) ||
        (c >= 0xf20 && c <= 0xf29) ||
        c == 0xb7 ||
        c == 0x2d0 ||
        c == 0x2d1 ||
        c == 0x387 ||
        c == 0x640 ||
        c == 0xe46 ||
        c == 0xec6 ||
        c == 0x3005 ||
        (c >= 0x3031 && c <= 0x3035) ||
        (c >= 0x309d && c <= 0x309e) ||
        (c >= 0x30fc && c <= 0x30fe));
}